

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O3

int mbedtls_ecdsa_sign_det_ext
              (mbedtls_ecp_group *grp,mbedtls_mpi *r,mbedtls_mpi *s,mbedtls_mpi *d,uchar *buf,
              size_t blen,mbedtls_md_type_t md_alg,_func_int_void_ptr_uchar_ptr_size_t *f_rng_blind,
              void *p_rng_blind)

{
  size_t sVar1;
  int iVar2;
  mbedtls_md_info_t *md_info;
  ulong buflen;
  mbedtls_mpi mStack_1d0;
  mbedtls_hmac_drbg_context mStack_1b8;
  uchar auStack_138 [136];
  mbedtls_hmac_drbg_context mStack_b0;
  
  sVar1 = grp->nbits;
  md_info = mbedtls_md_info_from_type(md_alg);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar2 = -0x4f80;
  }
  else {
    buflen = sVar1 + 7 >> 3;
    mbedtls_mpi_init(&mStack_1d0);
    mbedtls_hmac_drbg_init(&mStack_1b8);
    iVar2 = mbedtls_mpi_write_binary(d,auStack_138,buflen);
    if (((iVar2 == 0) && (iVar2 = derive_mpi(grp,&mStack_1d0,buf,blen), iVar2 == 0)) &&
       (iVar2 = mbedtls_mpi_write_binary(&mStack_1d0,auStack_138 + buflen,buflen), iVar2 == 0)) {
      mbedtls_hmac_drbg_seed_buf(&mStack_1b8,md_info,auStack_138,buflen * 2);
      if (f_rng_blind == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
        mbedtls_hmac_drbg_init(&mStack_b0);
        mbedtls_hmac_drbg_seed_buf(&mStack_b0,md_info,auStack_138,buflen * 2);
        iVar2 = mbedtls_hmac_drbg_update_ret(&mStack_b0,(uchar *)"BLINDING CONTEXT",0x10);
        if (iVar2 == 0) {
          iVar2 = ecdsa_sign_restartable
                            (grp,r,s,d,buf,blen,mbedtls_hmac_drbg_random,&mStack_1b8,
                             mbedtls_hmac_drbg_random,&mStack_b0,(mbedtls_ecdsa_restart_ctx *)blen);
        }
        mbedtls_hmac_drbg_free(&mStack_b0);
      }
      else {
        iVar2 = ecdsa_sign_restartable
                          (grp,r,s,d,buf,blen,mbedtls_hmac_drbg_random,&mStack_1b8,f_rng_blind,
                           p_rng_blind,(mbedtls_ecdsa_restart_ctx *)blen);
      }
    }
    mbedtls_hmac_drbg_free(&mStack_1b8);
    mbedtls_mpi_free(&mStack_1d0);
  }
  return iVar2;
}

Assistant:

int mbedtls_ecdsa_sign_det_ext( mbedtls_ecp_group *grp, mbedtls_mpi *r,
                                mbedtls_mpi *s, const mbedtls_mpi *d,
                                const unsigned char *buf, size_t blen,
                                mbedtls_md_type_t md_alg,
                                int (*f_rng_blind)(void *, unsigned char *,
                                                   size_t),
                                void *p_rng_blind )
{
    ECDSA_VALIDATE_RET( grp   != NULL );
    ECDSA_VALIDATE_RET( r     != NULL );
    ECDSA_VALIDATE_RET( s     != NULL );
    ECDSA_VALIDATE_RET( d     != NULL );
    ECDSA_VALIDATE_RET( buf   != NULL || blen == 0 );
    ECDSA_VALIDATE_RET( f_rng_blind != NULL );

    return( ecdsa_sign_det_restartable( grp, r, s, d, buf, blen, md_alg,
                                        f_rng_blind, p_rng_blind, NULL ) );
}